

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test::TestBody
          (TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test *this)

{
  bool bVar1;
  char *pcVar2;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  StringLike<std::__cxx11::basic_string<char>_> *substring_00;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_00;
  StringLike<std::__cxx11::basic_string<char>_> *substring_01;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_01;
  AssertHelper local_1c0;
  Message local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  string serialized;
  TextSerializerTest_shouldSerializeHistogramWithNoBuckets_Test *this_local;
  
  (this->super_TextSerializerTest).metric.histogram.sample_count = 2;
  (this->super_TextSerializerTest).metric.histogram.sample_sum = 32.0;
  (anonymous_namespace)::TextSerializerTest::Serialize_abi_cxx11_
            ((string *)&gtest_ar.message_,this,Histogram);
  std::operator+(&local_a0,&(this->super_TextSerializerTest).name,"_count 2");
  testing::HasSubstr<std::__cxx11::string>(&local_80,(testing *)&local_a0,substring);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_60,(internal *)&local_80,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_40,(char *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_60);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  std::operator+(&local_130,&(this->super_TextSerializerTest).name,"_sum 32\n");
  testing::HasSubstr<std::__cxx11::string>(&local_110,(testing *)&local_130,substring_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_f0,(internal *)&local_110,matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_d0,(char *)&local_f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_f0);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::operator+(&local_1b0,&(this->super_TextSerializerTest).name,"_bucket{le=\"+Inf\"} 2");
  testing::HasSubstr<std::__cxx11::string>(&local_190,(testing *)&local_1b0,substring_01);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_170,(internal *)&local_190,matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_150,(char *)&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_170);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogramWithNoBuckets) {
  metric.histogram.sample_count = 2;
  metric.histogram.sample_sum = 32.0;

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 32\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2"));
}